

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailureTest.cpp
# Opt level: O1

void __thiscall
TEST_TestFailure_BinaryEqualLast_Test::testBody(TEST_TestFailure_BinaryEqualLast_Test *this)

{
  UtestShell *pUVar1;
  char *pcVar2;
  TestTerminator *pTVar3;
  undefined1 auStack_a8 [16];
  uchar actualData [7];
  uchar expectedData [7];
  BinaryEqualFailure f;
  
  expectedData[4] = '\0';
  expectedData[5] = '\0';
  expectedData[6] = '\0';
  expectedData[0] = '\0';
  expectedData[1] = '\0';
  expectedData[2] = '\0';
  expectedData[3] = '\0';
  actualData[0] = '\0';
  actualData[1] = '\0';
  actualData[2] = '\0';
  actualData[3] = '\0';
  actualData[4] = '\0';
  actualData[5] = '\0';
  actualData[6] = '\x01';
  pUVar1 = (this->super_TEST_GROUP_CppUTestGroupTestFailure).test;
  SimpleString::SimpleString((SimpleString *)auStack_a8,"");
  BinaryEqualFailure::BinaryEqualFailure
            (&f,pUVar1,"fail.cpp",2,expectedData,actualData,7,(SimpleString *)auStack_a8);
  SimpleString::~SimpleString((SimpleString *)auStack_a8);
  pUVar1 = UtestShell::getCurrent();
  TestFailure::getMessage((TestFailure *)auStack_a8);
  pcVar2 = SimpleString::asCharString((SimpleString *)auStack_a8);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[9])
            (pUVar1,
             "expected <00 00 00 00 00 00 00>\n\tbut was  <00 00 00 00 00 00 01>\n\tdifference starts at position 6 at: <00 00 00 01         >\n\t                                               ^"
             ,pcVar2,"",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestFailureTest.cpp"
             ,0x176,pTVar3);
  SimpleString::~SimpleString((SimpleString *)auStack_a8);
  TestFailure::~TestFailure(&f.super_TestFailure);
  return;
}

Assistant:

TEST(TestFailure, BinaryEqualLast)
{
    const unsigned char expectedData[] = {0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00};
	const unsigned char actualData[] = {0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01};
    BinaryEqualFailure f(test, failFileName, failLineNumber, expectedData, actualData, sizeof(expectedData), "");
    FAILURE_EQUAL("expected <00 00 00 00 00 00 00>\n"
                "\tbut was  <00 00 00 00 00 00 01>\n"
    			"\tdifference starts at position 6 at: <00 00 00 01         >\n"
    			"\t                                               ^", f);
}